

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

ON_NurbsSurface * __thiscall
ON_NurbsCage::IsoSurface(ON_NurbsCage *this,int dir,double c,ON_NurbsSurface *srf)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  ON_NurbsCage *local_100;
  ON_NurbsSurface *iso_srf;
  int cage_ijk [3];
  int k;
  int j;
  int i;
  int k1;
  int j1;
  int i1;
  int cage_sizeofcv;
  double *cv;
  int kk;
  int jj;
  int ii;
  undefined1 local_78 [8];
  ON_NurbsCurve nurbs_curve;
  int span_index;
  int cage_cvdim;
  ON_NurbsSurface *srf_local;
  double c_local;
  int dir_local;
  ON_NurbsCage *this_local;
  
  if ((dir < 0) || (2 < dir)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
               ,0x542,"","ON_NurbsCage::IsoSurface - invalid dir parameter");
    this_local = (ON_NurbsCage *)0x0;
  }
  else if (((this->m_order[dir] < 2) || (this->m_cv_count[dir] < this->m_order[dir])) ||
          (this->m_knot[dir] == (double *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
               ,0x547,"","ON_NurbsCage::IsoSurface - invalid NURBS cage");
    this_local = (ON_NurbsCage *)0x0;
  }
  else {
    nurbs_curve.m_cv._4_4_ = CVSize(this);
    nurbs_curve.m_cv._0_4_ =
         ON_NurbsSpanIndex(this->m_order[dir],this->m_cv_count[dir],this->m_knot[dir],c,0,0);
    ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_78);
    nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._0_4_ =
         (nurbs_curve.m_cv._4_4_ * this->m_cv_count[0] * this->m_cv_count[1] * this->m_cv_count[2])
         / this->m_cv_count[dir];
    nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._4_4_ = 0;
    nurbs_curve.m_dim = this->m_order[dir];
    nurbs_curve.m_is_rat = nurbs_curve.m_dim;
    ON_NurbsCurve::ReserveCVCapacity
              ((ON_NurbsCurve *)local_78,
               (int)nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list *
               nurbs_curve.m_dim);
    nurbs_curve.m_knot._0_4_ =
         (int)nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list;
    ON_NurbsCurve::ManageKnotForExperts
              ((ON_NurbsCurve *)local_78,0,this->m_knot[dir] + (int)nurbs_curve.m_cv);
    kk = dir;
    if (dir == 0) {
      cv._4_4_ = 1;
      cv._0_4_ = 2;
    }
    else if (dir == 1) {
      cv._4_4_ = 0;
      cv._0_4_ = 2;
    }
    else if (dir == 2) {
      cv._4_4_ = 0;
      cv._0_4_ = 1;
    }
    else {
      kk = 0;
      cv._4_4_ = 1;
      cv._0_4_ = 2;
    }
    iVar5 = nurbs_curve.m_cv._4_4_ << 3;
    iVar6 = (int)nurbs_curve.m_cv + this->m_order[kk];
    iVar3 = this->m_cv_count[cv._4_4_];
    iVar1 = this->m_cv_count[(int)cv];
    for (k = (int)nurbs_curve.m_cv; k < iVar6; k = k + 1) {
      _i1 = ON_NurbsCurve::CV((ON_NurbsCurve *)local_78,k - (int)nurbs_curve.m_cv);
      cage_ijk[(long)kk + -2] = k;
      for (cage_ijk[2] = 0; cage_ijk[2] < iVar3; cage_ijk[2] = cage_ijk[2] + 1) {
        cage_ijk[(long)cv._4_4_ + -2] = cage_ijk[2];
        for (cage_ijk[1] = 0; cage_ijk[1] < iVar1; cage_ijk[1] = cage_ijk[1] + 1) {
          cage_ijk[(long)(int)cv + -2] = cage_ijk[1];
          pdVar4 = CV(this,(int)iso_srf,iso_srf._4_4_,cage_ijk[0]);
          memcpy(_i1,pdVar4,(long)iVar5);
          _i1 = _i1 + nurbs_curve.m_cv._4_4_;
        }
      }
    }
    local_100 = (ON_NurbsCage *)srf;
    if (srf == (ON_NurbsSurface *)0x0) {
      local_100 = (ON_NurbsCage *)ON_NurbsSurface::New();
    }
    ON_NurbsSurface::Create
              ((ON_NurbsSurface *)local_100,this->m_dim,(bool)(this->m_is_rat & 1),
               this->m_order[cv._4_4_],this->m_order[(int)cv],this->m_cv_count[cv._4_4_],
               this->m_cv_count[(int)cv]);
    ON_NurbsCurve::Evaluate
              ((ON_NurbsCurve *)local_78,c,0,
               (int)nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list,
               local_100->m_knot[2],0,(int *)0x0);
    nurbs_curve.m_knot_capacity_and_tags = 0;
    nurbs_curve._36_4_ = 0;
    pdVar4 = *(double **)local_100->m_knot_capacity;
    pdVar2 = this->m_knot[cv._4_4_];
    iVar3 = ON_NurbsSurface::KnotCount((ON_NurbsSurface *)local_100,0);
    memcpy(pdVar4,pdVar2,(long)iVar3 << 3);
    pdVar4 = *(double **)((long)local_100->m_knot_capacity + 8);
    pdVar2 = this->m_knot[(int)cv];
    iVar3 = ON_NurbsSurface::KnotCount((ON_NurbsSurface *)local_100,1);
    memcpy(pdVar4,pdVar2,(long)iVar3 << 3);
    this_local = local_100;
    ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_78);
  }
  return (ON_NurbsSurface *)this_local;
}

Assistant:

ON_NurbsSurface* ON_NurbsCage::IsoSurface(
        int dir,
        double c,
        ON_NurbsSurface* srf
        ) const
{
  // c = 0; cage(c,s,t) = srf(s,t)
  // c = 1; cage(r,c,t) = srf(r,t)
  // c = 2; cage(r,s,c) = srf(r,s)
  if ( dir < 0 || dir > 2 )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid dir parameter");
    return 0;
  }
  if ( m_order[dir] < 2 || m_cv_count[dir] < m_order[dir] || 0 == m_knot[dir] )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid NURBS cage");
    return 0;
  }

  const int cage_cvdim = CVSize();

  int span_index = ON_NurbsSpanIndex(m_order[dir],m_cv_count[dir],m_knot[dir],c,0,0);
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = cage_cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2]/m_cv_count[dir];
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = m_order[dir];
  nurbs_curve.m_cv_count = nurbs_curve.m_order;
  nurbs_curve.ReserveCVCapacity(nurbs_curve.m_dim*nurbs_curve.m_cv_count);
  nurbs_curve.m_cv_stride = nurbs_curve.m_dim;
  // nurbs_curve.m_knot[] shares memory with m_knot[dir] + span_index. nurbs_curve destructor does not free nurbs_curve.m_knot[]
  nurbs_curve.ManageKnotForExperts(0, m_knot[dir] + span_index);

  int ii,jj,kk;
  /*
  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];
  int k0 = 0;
  int k1 = m_cv_count[2];
  */

  //int i0 = span_index;
  //int i1 = span_index+m_order[dir];
  ii = dir;
  switch(dir)
  {
  case 0:
    jj = 1;
    kk = 2;
    break;
  case 1:
    jj = 0;
    kk = 2;
    break;
  case 2:
    jj = 0;
    kk = 1;
    break;
  default: // to keep lint happy
    ii = 0;
    jj = 1;
    kk = 2;
    break;
  };


  double* cv;
  const int cage_sizeofcv = cage_cvdim*sizeof(*cv);
  //int i0 = span_index;
  int i1 = span_index+m_order[ii];
  int j1 = m_cv_count[jj];
  int k1 = m_cv_count[kk];

  int i,j,k;
  int cage_ijk[3];
  for ( i = span_index; i < i1; i++) 
  {
    cv = nurbs_curve.CV(i-span_index);
    cage_ijk[ii] = i;
    for ( j = 0; j < j1; j++ ) 
    {
      cage_ijk[jj] = j;
      for ( k = 0; k < k1; k++ )
      {
        cage_ijk[kk] = k;
        memcpy(cv,CV(cage_ijk[0],cage_ijk[1],cage_ijk[2]),cage_sizeofcv);
        cv += cage_cvdim;
      }
    }
  }

  ON_NurbsSurface* iso_srf = srf ? srf : ON_NurbsSurface::New();
  iso_srf->Create(m_dim,m_is_rat,m_order[jj],m_order[kk],m_cv_count[jj],m_cv_count[kk]);
  nurbs_curve.Evaluate(c,0,nurbs_curve.m_dim,iso_srf->m_cv,0,0);
  nurbs_curve.m_knot = 0;
  memcpy(iso_srf->m_knot[0],m_knot[jj],iso_srf->KnotCount(0)*sizeof(*iso_srf->m_knot[0]));
  memcpy(iso_srf->m_knot[1],m_knot[kk],iso_srf->KnotCount(1)*sizeof(*iso_srf->m_knot[1]));

  return iso_srf;
}